

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_mutex.c
# Opt level: O2

void spin_mutex_lock(spin_mutex *m)

{
  int iVar1;
  int iVar2;
  
  iVar1 = __cilkrts_xchg(&m->lock,1);
  if (iVar1 != 0) {
    iVar1 = 0;
    do {
      do {
        __cilkrts_short_pause();
        if (iVar1 < 999) {
          iVar1 = iVar1 + 1;
        }
        else {
          __cilkrts_yield();
          iVar1 = 0;
        }
      } while (m->lock != 0);
      iVar2 = __cilkrts_xchg(&m->lock,1);
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void spin_mutex_lock(struct spin_mutex *m)
{
    int count;
    const int maxspin = 1000; /* SWAG */
    if (!TRY_ACQUIRE(m)) {
        count = 0;
        do {
            do {
                __cilkrts_short_pause();
                if (++count >= maxspin) {
                    /* let the OS reschedule every once in a while */
                    __cilkrts_yield();
                    count = 0;
                }
            } while (m->lock != 0);
        } while (!TRY_ACQUIRE(m));
    }
}